

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGhostObject.cpp
# Opt level: O1

void __thiscall
cbtGhostObject::addOverlappingObjectInternal
          (cbtGhostObject *this,cbtBroadphaseProxy *otherProxy,cbtBroadphaseProxy *thisProxy)

{
  uint uVar1;
  uint uVar2;
  cbtCollisionObject *pcVar3;
  cbtCollisionObject **ptr;
  cbtCollisionObject **ppcVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  
  pcVar3 = (cbtCollisionObject *)otherProxy->m_clientObject;
  uVar1 = (this->m_overlappingObjects).m_size;
  if (0 < (int)uVar1) {
    uVar6 = 0;
    do {
      if ((this->m_overlappingObjects).m_data[uVar6] == pcVar3) goto LAB_008eabe6;
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  uVar6 = (ulong)uVar1;
LAB_008eabe6:
  if ((uint)uVar6 == uVar1) {
    uVar2 = (this->m_overlappingObjects).m_capacity;
    if (uVar1 == uVar2) {
      iVar8 = 1;
      if ((ulong)uVar1 != 0) {
        iVar8 = uVar1 * 2;
      }
      if ((int)uVar2 < iVar8) {
        if (iVar8 == 0) {
          ppcVar4 = (cbtCollisionObject **)0x0;
        }
        else {
          ppcVar4 = (cbtCollisionObject **)cbtAlignedAllocInternal((long)iVar8 << 3,0x10);
        }
        lVar5 = (long)(this->m_overlappingObjects).m_size;
        if (0 < lVar5) {
          lVar7 = 0;
          do {
            ppcVar4[lVar7] = (this->m_overlappingObjects).m_data[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar5 != lVar7);
        }
        ptr = (this->m_overlappingObjects).m_data;
        if (ptr != (cbtCollisionObject **)0x0) {
          if ((this->m_overlappingObjects).m_ownsMemory == true) {
            cbtAlignedFreeInternal(ptr);
          }
          (this->m_overlappingObjects).m_data = (cbtCollisionObject **)0x0;
        }
        (this->m_overlappingObjects).m_ownsMemory = true;
        (this->m_overlappingObjects).m_data = ppcVar4;
        (this->m_overlappingObjects).m_capacity = iVar8;
      }
    }
    iVar8 = (this->m_overlappingObjects).m_size;
    (this->m_overlappingObjects).m_data[iVar8] = pcVar3;
    (this->m_overlappingObjects).m_size = iVar8 + 1;
  }
  return;
}

Assistant:

void cbtGhostObject::addOverlappingObjectInternal(cbtBroadphaseProxy* otherProxy, cbtBroadphaseProxy* thisProxy)
{
	cbtCollisionObject* otherObject = (cbtCollisionObject*)otherProxy->m_clientObject;
	cbtAssert(otherObject);
	///if this linearSearch becomes too slow (too many overlapping objects) we should add a more appropriate data structure
	int index = m_overlappingObjects.findLinearSearch(otherObject);
	if (index == m_overlappingObjects.size())
	{
		//not found
		m_overlappingObjects.push_back(otherObject);
	}
}